

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-alloc.c
# Opt level: O3

ggml_backend_buffer *
ggml_backend_alloc_ctx_tensors_from_buft(ggml_context *ctx,ggml_backend_buffer_type_t buft)

{
  ggml_backend_buffer_t *__ptr;
  _Bool _Var1;
  size_t sVar2;
  size_t sVar3;
  ggml_tensor *tensor;
  size_t sVar4;
  ggml_backend_buffer_t pgVar5;
  ulong uVar6;
  ggml_tensor *first;
  ulong size;
  ggml_backend_buffer_t *buffers;
  size_t n_buffers;
  ggml_backend_buffer_t *local_58;
  ggml_backend_buffer_type_t local_50;
  size_t local_48;
  long local_40;
  ulong local_38;
  
  _Var1 = ggml_get_no_alloc(ctx);
  if (!_Var1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-alloc.c"
               ,0x3d9,"GGML_ASSERT(%s) failed","ggml_get_no_alloc(ctx) == true");
  }
  sVar2 = ggml_backend_buft_get_alignment(buft);
  local_50 = buft;
  sVar3 = ggml_backend_buft_get_max_size(buft);
  pgVar5 = (ggml_backend_buffer_t)0x0;
  local_58 = (ggml_backend_buffer_t *)0x0;
  local_48 = 0;
  tensor = ggml_get_first_tensor(ctx);
  if (tensor != (ggml_tensor *)0x0) {
    local_40 = sVar2 - 1;
    local_38 = -sVar2;
    first = tensor;
    sVar2 = 0;
    do {
      if ((tensor->data == (void *)0x0) && (tensor->view_src == (ggml_tensor *)0x0)) {
        sVar4 = ggml_backend_buft_get_alloc_size(local_50,tensor);
        uVar6 = sVar4 + local_40 & local_38;
      }
      else {
        uVar6 = 0;
      }
      size = uVar6 + sVar2;
      if (((sVar2 != 0) && (sVar3 < size)) &&
         (_Var1 = alloc_tensor_range(ctx,first,tensor,local_50,sVar2,&local_58,&local_48),
         first = tensor, size = uVar6, !_Var1)) goto LAB_00124b4b;
      tensor = ggml_get_next_tensor(ctx,tensor);
      sVar2 = size;
    } while (tensor != (ggml_tensor *)0x0);
    if ((size != 0) &&
       (_Var1 = alloc_tensor_range(ctx,first,(ggml_tensor *)0x0,local_50,size,&local_58,&local_48),
       !_Var1)) {
      return (ggml_backend_buffer *)0x0;
    }
    __ptr = local_58;
    if (local_48 == 0) {
LAB_00124b4b:
      pgVar5 = (ggml_backend_buffer_t)0x0;
    }
    else {
      if (local_48 == 1) {
        pgVar5 = *local_58;
      }
      else {
        pgVar5 = ggml_backend_multi_buffer_alloc_buffer(local_58,local_48);
      }
      free(__ptr);
    }
  }
  return pgVar5;
}

Assistant:

ggml_backend_buffer_t ggml_backend_alloc_ctx_tensors_from_buft(struct ggml_context * ctx, ggml_backend_buffer_type_t buft) {
    GGML_ASSERT(ggml_get_no_alloc(ctx) == true);

    size_t alignment = ggml_backend_buft_get_alignment(buft);
    size_t max_size = ggml_backend_buft_get_max_size(buft);

    ggml_backend_buffer_t * buffers = NULL;
    size_t n_buffers = 0;

    size_t cur_buf_size = 0;
    struct ggml_tensor * first = ggml_get_first_tensor(ctx);
    for (struct ggml_tensor * t = first; t != NULL; t = ggml_get_next_tensor(ctx, t)) {
        size_t this_size = 0;
        if (t->data == NULL && t->view_src == NULL) {
            this_size = GGML_PAD(ggml_backend_buft_get_alloc_size(buft, t), alignment);
        }

        if (cur_buf_size > 0 && (cur_buf_size + this_size) > max_size) {
            // allocate tensors in the current buffer
            if (!alloc_tensor_range(ctx, first, t, buft, cur_buf_size, &buffers, &n_buffers)) {
                return NULL;
            }
            first = t;
            cur_buf_size = this_size;
        } else {
            cur_buf_size += this_size;
        }
    }

    // allocate remaining tensors
    if (cur_buf_size > 0) {
        if (!alloc_tensor_range(ctx, first, NULL, buft, cur_buf_size, &buffers, &n_buffers)) {
            return NULL;
        }
    }

    if (n_buffers == 0) {
#ifndef NDEBUG
        GGML_LOG_DEBUG("%s: all tensors in the context are already allocated\n", __func__);
#endif
        return NULL;
    }

    ggml_backend_buffer_t buffer;
    if (n_buffers == 1) {
        buffer = buffers[0];
    } else {
        buffer = ggml_backend_multi_buffer_alloc_buffer(buffers, n_buffers);
    }
    free(buffers);
    return buffer;
}